

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O2

void __thiscall CppCNN::CppCNN(CppCNN *this)

{
  (this->__layers).
  super__Vector_base<std::shared_ptr<LayerBase>,_std::allocator<std::shared_ptr<LayerBase>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->__layers).
  super__Vector_base<std::shared_ptr<LayerBase>,_std::allocator<std::shared_ptr<LayerBase>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_enable_shared_from_this<CppCNN>)._M_weak_this.
  super___weak_ptr<CppCNN,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<CppCNN>)._M_weak_this.
  super___weak_ptr<CppCNN,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->__layers).
  super__Vector_base<std::shared_ptr<LayerBase>,_std::allocator<std::shared_ptr<LayerBase>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CppMLNN::CppMLNN(&this->__fcnn);
  (this->__hidden_layers_size).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->__examples_num = 0;
  (this->__hidden_layers_size).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->__hidden_layers_size).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->__input_size = 0;
  this->__output_size = 0;
  this->__learn_rate_init = 0.0003;
  this->__learn_rate = 0.0003;
  this->__learn_rate_decay = 0.95;
  this->__beta1 = 0.9;
  this->__beta2 = 0.999;
  this->__epsilon_rmsprop = 1e-08;
  this->__lambda = 0.0;
  this->__sgd_enabled = true;
  this->__momentum_enabled = true;
  this->__adam_enabled = false;
  this->__learn_rate_decay_enabled = false;
  this->__epoch_batch = 0;
  this->__epoch = 0;
  this->__epoch_max = -1;
  this->__loss = INFINITY;
  this->__minimum_loss = 0.0;
  this->__mini_batch_size = 0x100;
  return;
}

Assistant:

CppCNN::CppCNN() {
}